

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getDirectory_abi_cxx11_(ApprovalTestNamer *this)

{
  string *in_RDI;
  ApprovalTestNamer *in_stack_00000018;
  string sub_directory;
  string *directory;
  string local_38 [16];
  ApprovalTestNamer *in_stack_ffffffffffffffd8;
  
  getTestSourceDirectory_abi_cxx11_(in_stack_ffffffffffffffd8);
  getApprovalsSubdirectory_abi_cxx11_(in_stack_00000018);
  ::std::__cxx11::string::operator+=((string *)in_RDI,local_38);
  SystemUtils::ensureDirectoryExists((string *)0x1bf90b);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getDirectory() const
    {
        std::string directory = getTestSourceDirectory();
        std::string sub_directory = getApprovalsSubdirectory();
        directory += sub_directory;
        SystemUtils::ensureDirectoryExists(directory);
        return directory;
    }